

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stack_trace_table.cc
# Opt level: O3

void ** __thiscall tcmalloc::StackTraceTable::ReadStackTracesAndClear(StackTraceTable *this)

{
  void *pvVar1;
  int iVar2;
  StackTrace *pSVar3;
  int iVar4;
  int iVar5;
  void **ppvVar6;
  long lVar7;
  int iVar8;
  Entry *head_1;
  Entry *head;
  Entry *pEVar9;
  void *pvVar10;
  size_t size;
  Entry *pEVar11;
  bool bVar12;
  SpinLockHolder local_28;
  SpinLockHolder h;
  
  pEVar11 = this->head_;
  if (pEVar11 == (Entry *)0x0) {
    ppvVar6 = (void **)operator_new__(8);
    lVar7 = 0;
  }
  else {
    iVar4 = 0;
    pEVar9 = pEVar11;
    iVar5 = 0;
    do {
      iVar8 = iVar5;
      pSVar3 = &pEVar9->trace;
      pEVar9 = pEVar9->next;
      iVar2 = (int)pSVar3->depth;
      iVar4 = iVar4 + 3;
      iVar5 = iVar8 + iVar2;
    } while (pEVar9 != (Entry *)0x0);
    iVar8 = iVar8 + iVar2;
    size = 0xffffffffffffffff;
    if (-2 < iVar8 + iVar4) {
      size = (ulong)(iVar4 + iVar8 + 1) << 3;
    }
    ppvVar6 = (void **)operator_new__(size);
    iVar5 = 0;
    do {
      pEVar9 = pEVar11->next;
      ppvVar6[iVar5] = (void *)0x1;
      ppvVar6[(long)iVar5 + 1] = (void *)(pEVar11->trace).size;
      pvVar1 = (void *)(pEVar11->trace).depth;
      iVar4 = iVar5 + 3;
      ppvVar6[(long)iVar5 + 2] = pvVar1;
      iVar5 = iVar4;
      if (pvVar1 != (void *)0x0) {
        pvVar10 = (void *)0x0;
        do {
          ppvVar6[(long)iVar4 + (long)pvVar10] = (pEVar11->trace).stack[(long)pvVar10];
          pvVar10 = (void *)((long)pvVar10 + 1);
        } while (pvVar1 != pvVar10);
        iVar5 = iVar4 + (int)pvVar10;
      }
      pEVar11 = pEVar9;
    } while (pEVar9 != (Entry *)0x0);
    lVar7 = (long)iVar5;
  }
  ppvVar6[lVar7] = (void *)0x0;
  this->error_ = false;
  local_28.lock_ = (SpinLock *)(Static::pageheap_ + 8);
  LOCK();
  bVar12 = Static::pageheap_._8_4_ == 0;
  if (bVar12) {
    Static::pageheap_._8_4_ = 1;
  }
  UNLOCK();
  if (!bVar12) {
    SpinLock::SlowLock((SpinLock *)(Static::pageheap_ + 8));
  }
  pEVar11 = this->head_;
  while (pEVar9 = pEVar11, pEVar9 != (Entry *)0x0) {
    pEVar11 = pEVar9->next;
    pEVar9->next = (Entry *)STLPageHeapAllocator<tcmalloc::StackTraceTable::Entry,_void>::
                            underlying_.allocator.free_list_;
    STLPageHeapAllocator<tcmalloc::StackTraceTable::Entry,_void>::underlying_.allocator.inuse_ =
         STLPageHeapAllocator<tcmalloc::StackTraceTable::Entry,_void>::underlying_.allocator.inuse_
         + -1;
    STLPageHeapAllocator<tcmalloc::StackTraceTable::Entry,_void>::underlying_.allocator.free_list_ =
         pEVar9;
  }
  this->head_ = (Entry *)0x0;
  SpinLockHolder::~SpinLockHolder(&local_28);
  return ppvVar6;
}

Assistant:

void** StackTraceTable::ReadStackTracesAndClear() {
  std::unique_ptr<void*[]> out = ProduceStackTracesDump(
    +[] (const void** current_head) -> const StackTrace* {
      const Entry* head = static_cast<const Entry*>(*current_head);
      *current_head = head->next;
      return &head->trace;
    }, head_);

  // Clear state
  error_ = false;

  SpinLockHolder h(Static::pageheap_lock());
  Entry* entry = head_;
  while (entry != nullptr) {
    Entry* next = entry->next;
    allocator_.deallocate(entry, 1);
    entry = next;
  }
  head_ = nullptr;

  return out.release();
}